

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.h
# Opt level: O1

float __thiscall
lunasvg::LengthContext::valueForLength(LengthContext *this,Length *length,LengthDirection direction)

{
  float fVar1;
  LengthUnits LVar2;
  float fVar3;
  Size SVar4;
  
  LVar2 = length->m_units;
  if (LVar2 == Ex) {
    return length->m_value * this->m_element->m_font_size * 0.5;
  }
  if (LVar2 == Em) {
    return length->m_value * this->m_element->m_font_size;
  }
  if (LVar2 != Percent) {
    return length->m_value;
  }
  fVar1 = length->m_value;
  if (this->m_units != UserSpaceOnUse) {
    return fVar1 / 100.0;
  }
  SVar4 = SVGElement::currentViewportSize(this->m_element);
  fVar3 = SVar4.h;
  if (direction == Vertical) {
    SVar4.h = 0.0;
    SVar4.w = fVar3;
  }
  else if (direction != Horizontal) {
    fVar3 = SVar4.w * SVar4.w + fVar3 * fVar3;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    SVar4.w = fVar3 / 1.4142135;
    SVar4.h = 0.0;
  }
  return (fVar1 * SVar4.w) / 100.0;
}

Assistant:

float value() const { return m_value; }